

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

void __thiscall cfd::core::Psbt::SetGlobalRecord(Psbt *this,ByteData *key,ByteData *value)

{
  void *pvVar1;
  bool bVar2;
  CfdException *pCVar3;
  wally_map *map_object;
  allocator local_75;
  int ret;
  undefined1 local_70 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> key_vec;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val_vec;
  
  pvVar1 = this->wally_psbt_pointer_;
  bVar2 = ByteData::IsEmpty(key);
  if (bVar2) {
    local_70._0_8_ = "cfdcore_psbt.cpp";
    local_70._8_4_ = 0xcc3;
    local_70._16_8_ = "SetGlobalRecord";
    logger::warn<>((CfdSourceLocation *)local_70,"psbt empty key error.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_70,"psbt empty key error.",(allocator *)&key_vec)
    ;
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  ByteData::GetBytes(&key_vec,key);
  ByteData::GetBytes(&val_vec,value);
  if (pvVar1 == (void *)0x0) {
    local_70._0_8_ = "cfdcore_psbt.cpp";
    local_70._8_4_ = 0x375;
    local_70._16_8_ = "SetPsbtGlobal";
    logger::warn<>((CfdSourceLocation *)local_70,"psbt pointer is null");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_70,"psbt pointer is null.",(allocator *)&ret);
    CfdException::CfdException(pCVar3,kCfdIllegalStateError,(string *)local_70);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (*key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start == 0xfb) {
    if ((long)key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start == 1) {
      local_70._0_8_ = "cfdcore_psbt.cpp";
      local_70._8_4_ = 0x38a;
      local_70._16_8_ = "SetPsbtGlobal";
      logger::warn<>((CfdSourceLocation *)local_70,"setting global version is not supported.");
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string
                ((string *)local_70,"psbt setting global version is not supported error.",&local_75)
      ;
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    local_70._0_8_ = "cfdcore_psbt.cpp";
    local_70._8_4_ = 0x386;
    local_70._16_8_ = "SetPsbtGlobal";
    logger::warn<>((CfdSourceLocation *)local_70,"psbt invalid key format.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_70,"psbt invalid key format error.",&local_75);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if (*key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_start != '\0') {
    ::std::__cxx11::string::string((string *)local_70,"global unknowns",&local_75);
    map_object = (wally_map *)((long)pvVar1 + 0x40);
    FindPsbtMap(map_object,&key_vec,(string *)local_70,(size_t *)0x0);
    ::std::__cxx11::string::~string((string *)local_70);
    ret = wally_map_add(map_object,
                        key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)key_vec.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)key_vec.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                        val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)val_vec.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish -
                        (long)val_vec.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
    if (ret != 0) {
      local_70._0_8_ = "cfdcore_psbt.cpp";
      local_70._8_4_ = 0x393;
      local_70._16_8_ = "SetPsbtGlobal";
      logger::warn<int&>((CfdSourceLocation *)local_70,"wally_map_add NG[{}]",&ret);
      pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)local_70,"psbt add global unknowns error.",&local_75)
      ;
      CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
      __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
    }
    ret = wally_map_sort(map_object,0);
    if (ret == 0) {
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&val_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return;
    }
    local_70._0_8_ = "cfdcore_psbt.cpp";
    local_70._8_4_ = 0xccd;
    local_70._16_8_ = "SetGlobalRecord";
    logger::warn<int&>((CfdSourceLocation *)local_70,"wally_map_sort NG[{}]",&ret);
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string((string *)local_70,"psbt sort unknowns error.",&local_75);
    CfdException::CfdException(pCVar3,kCfdInternalError,(string *)local_70);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  if ((long)key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)key_vec.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start == 1) {
    local_70._0_8_ = "cfdcore_psbt.cpp";
    local_70._8_4_ = 0x380;
    local_70._16_8_ = "SetPsbtGlobal";
    logger::warn<>((CfdSourceLocation *)local_70,"setting global tx is not supported.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)local_70,"psbt setting global tx is not supported error.",&local_75);
    CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
    __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
  }
  local_70._0_8_ = "cfdcore_psbt.cpp";
  local_70._8_4_ = 0x37c;
  local_70._16_8_ = "SetPsbtGlobal";
  logger::warn<>((CfdSourceLocation *)local_70,"psbt invalid key format.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string((string *)local_70,"psbt invalid key format error.",&local_75);
  CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)local_70);
  __cxa_throw(pCVar3,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void Psbt::SetGlobalRecord(const ByteData &key, const ByteData &value) {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (key.IsEmpty()) {
    warn(CFD_LOG_SOURCE, "psbt empty key error.");
    throw CfdException(kCfdIllegalArgumentError, "psbt empty key error.");
  }
  auto key_vec = key.GetBytes();
  auto val_vec = value.GetBytes();

  SetPsbtGlobal(key_vec, val_vec, psbt_pointer);

  int ret = wally_map_sort(&psbt_pointer->unknowns, 0);
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_map_sort NG[{}]", ret);
    throw CfdException(kCfdInternalError, "psbt sort unknowns error.");
  }
}